

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O1

void Function_Pool::ConvertToRgb
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  FunctionTask local_170;
  
  FunctionPoolTask::FunctionPoolTask(&local_170.super_FunctionPoolTask);
  local_170.super_FunctionPoolTask.super_TaskProviderSingleton.super_AbstractTaskProvider.
  _vptr_AbstractTaskProvider = (_func_int **)&PTR__FunctionTask_00219a60;
  local_170.functionId = _none;
  local_170._dataIn.minThreshold = '\0';
  local_170._dataIn.maxThreshold = 0xff;
  local_170._dataIn.horizontalProjection = false;
  local_170._dataIn.coefficientA = 1.0;
  local_170._dataIn.coefficientGamma = 1.0;
  local_170._dataIn.extractChannelId = 0xff;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataIn.lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.histogram.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.projection.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.sum.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170._dataOut.equality.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionPoolTask::_setup
            (&local_170.super_FunctionPoolTask,in,startXIn,startYIn,out,startXOut,startYOut,width,
             height);
  local_170.functionId = _ConvertToRgb;
  FunctionPoolTask::_processTask(&local_170.super_FunctionPoolTask);
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height )
    {
        FunctionTask().ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
    }